

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O3

int __thiscall CVmObjCharSet::equals(CVmObjCharSet *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  size_t len;
  uint uVar4;
  int iVar5;
  
  if (val->typ == VM_OBJ) {
    uVar1 = (val->val).obj;
    uVar4 = 1;
    if (uVar1 != self) {
      iVar5 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),metaclass_reg_);
      if (iVar5 == 0) {
        uVar4 = 0;
      }
      else {
        pcVar2 = (this->super_CVmObject).ext_;
        lVar3 = *(long *)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff]
                                 .ptr_ + 8);
        len = *(size_t *)(pcVar2 + 0x10);
        uVar4 = 0;
        if (len == *(size_t *)(lVar3 + 0x10)) {
          iVar5 = memicmp(pcVar2 + 0x18,(void *)(lVar3 + 0x18),len);
          uVar4 = (uint)(iVar5 == 0);
        }
      }
    }
    return uVar4;
  }
  return 0;
}

Assistant:

int CVmObjCharSet::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                          int /*depth*/) const
{
    CVmObjCharSet *other;
    const vmobj_charset_ext_t *ext;
    const vmobj_charset_ext_t *other_ext;

    /* if it's a self-reference, it's certainly equal */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* if it's not another character set, it's not equal */
    if (val->typ != VM_OBJ || !is_charset(vmg_ val->val.obj))
        return FALSE;

    /* we know it's another character set - cast it */
    other = (CVmObjCharSet *)vm_objp(vmg_ val->val.obj);

    /* get my extension and the other extension */
    ext = get_ext_ptr();
    other_ext = other->get_ext_ptr();

    /* it's equal if it has the same name (ignoring case) */
    return (ext->charset_name_len == other_ext->charset_name_len
            && memicmp(ext->charset_name, other_ext->charset_name,
                       ext->charset_name_len) == 0);
}